

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

Promise<void> __thiscall kj::UnixEventPort::FdObserver::whenWriteDisconnected(FdObserver *this)

{
  undefined8 *puVar1;
  long *plVar2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  long in_RSI;
  Promise<void> PVar4;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  newPromiseAndFulfiller<void>();
  puVar1 = *(undefined8 **)(in_RSI + 0x40);
  plVar2 = *(long **)(in_RSI + 0x48);
  *(undefined4 *)(in_RSI + 0x40) = local_28;
  *(undefined4 *)(in_RSI + 0x44) = uStack_24;
  *(undefined4 *)(in_RSI + 0x48) = uStack_20;
  *(undefined4 *)(in_RSI + 0x4c) = uStack_1c;
  if (plVar2 == (long *)0x0) {
    this->eventPort = (UnixEventPort *)CONCAT44(uStack_34,local_38);
    this->fd = (int)uStack_30;
    this->flags = uStack_30._4_4_;
    pPVar3 = extraout_RDX;
  }
  else {
    (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    *(undefined4 *)&this->eventPort = local_38;
    *(undefined4 *)((long)&this->eventPort + 4) = uStack_34;
    this->fd = (int)uStack_30;
    this->flags = uStack_30._4_4_;
    pPVar3 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<void> UnixEventPort::FdObserver::whenWriteDisconnected() {
  auto paf = newPromiseAndFulfiller<void>();
  hupFulfiller = kj::mv(paf.fulfiller);
  return kj::mv(paf.promise);
}